

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O2

void __thiscall QProgressDialogPrivate::layout(QProgressDialogPrivate *this)

{
  QWidget *this_00;
  QWidget *this_01;
  uint uVar1;
  int ax;
  int iVar2;
  int aw;
  QStyle *pQVar3;
  ulong uVar4;
  ulong uVar5;
  QWidgetData *pQVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int ah;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  pQVar3 = QWidget::style(this_00);
  uVar1 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x50,0,this_00);
  uVar17 = (ulong)uVar1;
  pQVar3 = QWidget::style(this_00);
  uVar1 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x4e,0,this_00);
  uVar15 = (ulong)uVar1;
  iVar9 = (((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) + 1) / 10;
  pQVar3 = QWidget::style(this_00);
  ax = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x4b,0,this_00);
  if (iVar9 < ax) {
    ax = iVar9;
  }
  iVar10 = (((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) + 1) / 10;
  pQVar3 = QWidget::style(this_00);
  iVar9 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x4d,0,this_00);
  if (iVar10 < iVar9) {
    iVar9 = iVar10;
  }
  pQVar3 = QWidget::style(this_00);
  iVar10 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,9,0,this_00,0);
  uVar4 = 0;
  uVar13 = 0;
  if (this->cancel != (QPushButton *)0x0) {
    uVar4 = (**(code **)(*(long *)&(this->cancel->super_QAbstractButton).super_QWidget + 0x70))();
    uVar13 = uVar4 >> 0x20;
  }
  uVar5 = (**(code **)(*(long *)&this->bar->super_QWidget + 0x70))();
  uVar5 = uVar5 >> 0x20;
  this_01 = (QWidget *)this->cancel;
  iVar12 = -5;
  iVar11 = 0;
  while( true ) {
    ah = (int)uVar5;
    iVar14 = (int)uVar15;
    iVar16 = (int)uVar17;
    iVar7 = (int)uVar13;
    if (iVar12 == 0) break;
    iVar11 = iVar16 + iVar7;
    if (this_01 == (QWidget *)0x0) {
      iVar11 = 0;
    }
    iVar2 = ((this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i) + 1;
    iVar11 = iVar2 - (ah + iVar14 + iVar16 + iVar11);
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    if (iVar2 / 4 <= iVar11) break;
    uVar17 = (long)iVar16 / 2 & 0xffffffff;
    uVar1 = (uint)((long)iVar16 / 2);
    iVar7 = iVar7 - uVar1;
    if (iVar7 < 7) {
      iVar7 = 6;
    }
    uVar8 = (ulong)(iVar7 - 2);
    if (this_01 == (QWidget *)0x0) {
      uVar8 = uVar13;
    }
    uVar1 = ah + ~uVar1;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 5) {
      uVar5 = 4;
    }
    iVar12 = iVar12 + 1;
    uVar15 = (long)iVar14 / 2 & 0xffffffff;
    uVar13 = uVar8;
  }
  if (this_01 != (QWidget *)0x0) {
    pQVar6 = this_00->data;
    iVar12 = (pQVar6->crect).x1.m_i;
    iVar2 = (pQVar6->crect).x2.m_i;
    aw = (int)uVar4;
    if (iVar10 == 0) {
      iVar10 = (iVar2 - (iVar12 + iVar9 + aw)) + 1;
    }
    else {
      iVar10 = (int)((long)((ulong)(uint)(aw >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / -2) +
               ((iVar2 - iVar12) + 1) / 2;
    }
    QWidget::setGeometry
              (this_01,iVar10,
               ((pQVar6->crect).y2.m_i - (iVar14 + iVar7 + (pQVar6->crect).y1.m_i)) + 1,aw,iVar7);
  }
  pQVar6 = this_00->data;
  if ((QWidget *)this->label != (QWidget *)0x0) {
    QWidget::setGeometry
              ((QWidget *)this->label,ax,0,
               ((pQVar6->crect).x2.m_i - ((pQVar6->crect).x1.m_i + iVar9 + ax)) + 1,iVar11);
    pQVar6 = this_00->data;
  }
  QWidget::setGeometry
            (&this->bar->super_QWidget,ax,iVar11 + iVar16,
             ((pQVar6->crect).x2.m_i - (iVar9 + ax + (pQVar6->crect).x1.m_i)) + 1,ah);
  return;
}

Assistant:

void QProgressDialogPrivate::layout()
{
    Q_Q(QProgressDialog);
    int sp = q->style()->pixelMetric(QStyle::PM_LayoutVerticalSpacing, nullptr, q);
    int mb = q->style()->pixelMetric(QStyle::PM_LayoutBottomMargin, nullptr, q);
    int ml = qMin(q->width() / 10, q->style()->pixelMetric(QStyle::PM_LayoutLeftMargin, nullptr, q));
    int mr = qMin(q->width() / 10, q->style()->pixelMetric(QStyle::PM_LayoutRightMargin, nullptr, q));
    const bool centered =
        bool(q->style()->styleHint(QStyle::SH_ProgressDialog_CenterCancelButton, nullptr, q));

    int additionalSpacing = 0;
    QSize cs = cancel ? cancel->sizeHint() : QSize(0,0);
    QSize bh = bar->sizeHint();
    int cspc;
    int lh = 0;

    // Find spacing and sizes that fit.  It is important that a progress
    // dialog can be made very small if the user demands it so.
    for (int attempt=5; attempt--;) {
        cspc = cancel ? cs.height() + sp : 0;
        lh = qMax(0, q->height() - mb - bh.height() - sp - cspc);

        if (lh < q->height()/4) {
            // Getting cramped
            sp /= 2;
            mb /= 2;
            if (cancel) {
                cs.setHeight(qMax(4,cs.height()-sp-2));
            }
            bh.setHeight(qMax(4,bh.height()-sp-1));
        } else {
            break;
        }
    }

    if (cancel) {
        cancel->setGeometry(
            centered ? q->width()/2 - cs.width()/2 : q->width() - mr - cs.width(),
            q->height() - mb - cs.height(),
            cs.width(), cs.height());
    }

    if (label)
        label->setGeometry(ml, additionalSpacing, q->width() - ml - mr, lh);
    bar->setGeometry(ml, lh + sp + additionalSpacing, q->width() - ml - mr, bh.height());
}